

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomAngMomCorrFunc.cpp
# Opt level: O0

int __thiscall
OpenMD::MomAngMomCorrFunc::computeProperty1(MomAngMomCorrFunc *this,int frame,StuntDouble *sd)

{
  Vector<double,_3U> *v1;
  reference this_00;
  size_type sVar1;
  StuntDouble *in_RDX;
  int in_ESI;
  StuntDouble *in_RDI;
  Vector<double,_3U> *v;
  
  v1 = (Vector<double,_3U> *)
       std::
       vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
       ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                     *)&in_RDI[0x1e].localIndex_,(long)in_ESI);
  v = (Vector<double,_3U> *)StuntDouble::getMass(in_RDX);
  StuntDouble::getVel(in_RDI);
  OpenMD::operator*((double)in_RDI,v1);
  Vector3<double>::Vector3((Vector3<double> *)v1,v);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)v1,
             (value_type *)v);
  this_00 = std::
            vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                          *)&in_RDI[0x1e].localIndex_,(long)in_ESI);
  sVar1 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                    (this_00);
  return (int)sVar1 + -1;
}

Assistant:

int MomAngMomCorrFunc::computeProperty1(int frame, StuntDouble* sd) {
    momenta_[frame].push_back(sd->getMass() * sd->getVel());
    return momenta_[frame].size() - 1;
  }